

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StateDistributionVector.h
# Opt level: O0

string * __thiscall StateDistributionVector::SoftPrint_abi_cxx11_(StateDistributionVector *this)

{
  string *in_RDI;
  vector<double,_std::allocator<double>_> *in_stack_000001d8;
  
  PrintTools::SoftPrintVector<double>(in_stack_000001d8);
  return in_RDI;
}

Assistant:

virtual std::string SoftPrint() const
        { return SoftPrintVector( *((SDV*)this) ); }